

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VoxWriter.cpp
# Opt level: O0

bool __thiscall vox::VoxWriter::m_OpenFileForWriting(VoxWriter *this,string *vFilePathName)

{
  char *__filename;
  FILE *pFVar1;
  int *piVar2;
  int local_2c;
  string *vFilePathName_local;
  VoxWriter *this_local;
  
  __filename = (char *)std::__cxx11::string::c_str();
  pFVar1 = fopen(__filename,"wb");
  this->m_File = (FILE *)pFVar1;
  if (this->m_File == (FILE *)0x0) {
    piVar2 = __errno_location();
    local_2c = *piVar2;
  }
  else {
    local_2c = 0;
  }
  this->lastError = local_2c;
  return this->lastError == 0;
}

Assistant:

bool VoxWriter::m_OpenFileForWriting(const std::string& vFilePathName) {
#if _MSC_VER
    lastError = fopen_s(&m_File, vFilePathName.c_str(), "wb");
#else
    m_File    = fopen(vFilePathName.c_str(), "wb");
    lastError = m_File ? 0 : errno;
#endif
    if (lastError != 0)
        return false;
    return true;
}